

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.h
# Opt level: O2

void __thiscall soplex::SLUFactorRational::SLUFactorRational(SLUFactorRational *this)

{
  int iVar1;
  Timer *pTVar2;
  EVP_PKEY_CTX *ctx;
  shared_ptr<soplex::Tolerances> local_68;
  shared_ptr<soplex::Tolerances> local_58;
  shared_ptr<soplex::Tolerances> local_48;
  
  (this->super_SLinSolverRational)._vptr_SLinSolverRational =
       (_func_int **)&PTR___cxa_pure_virtual_0053d190;
  memset(&this->super_CLUFactorRational,0,0x2b0);
  CLUFactorRational::CLUFactorRational(&this->super_CLUFactorRational);
  (this->super_SLinSolverRational)._vptr_SLinSolverRational = (_func_int **)&PTR_getName_0053c5a0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase(&this->vec,1);
  local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SSVectorBase(&this->ssvec,1,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this->usetup = false;
  this->uptype = FOREST_TOMLIN;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SSVectorBase(&this->eta,1,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SSVectorBase(&this->forest,1,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)&this->lastThreshold);
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)&this->minThreshold);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
               *)&this->minThreshold,(longdouble)0.01);
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)&this->minStability);
  this->timerType = USER_TIME;
  (this->super_CLUFactorRational).u.row.elem = (Dring *)0x0;
  (this->super_CLUFactorRational).u.col.elem = (Dring *)0x0;
  (this->super_CLUFactorRational).u.col.idx = (int *)0x0;
  (this->super_CLUFactorRational).l.idx = (int *)0x0;
  (this->super_CLUFactorRational).thedim = 0;
  (this->super_CLUFactorRational).nzCnt = 0;
  (this->super_CLUFactorRational).row.orig = (int *)0x0;
  (this->super_CLUFactorRational).row.perm = (int *)0x0;
  (this->super_CLUFactorRational).col.orig = (int *)0x0;
  (this->super_CLUFactorRational).col.perm = (int *)0x0;
  (this->super_CLUFactorRational).l.start = (int *)0x0;
  (this->super_CLUFactorRational).l.row = (int *)0x0;
  (this->super_CLUFactorRational).l.ridx = (int *)0x0;
  (this->super_CLUFactorRational).l.rbeg = (int *)0x0;
  (this->super_CLUFactorRational).l.rorig = (int *)0x0;
  (this->super_CLUFactorRational).l.rperm = (int *)0x0;
  (this->super_CLUFactorRational).u.row.idx = (int *)0x0;
  (this->super_CLUFactorRational).u.row.start = (int *)0x0;
  (this->super_CLUFactorRational).u.row.len = (int *)0x0;
  (this->super_CLUFactorRational).u.row.max = (int *)0x0;
  (this->super_CLUFactorRational).u.col.start = (int *)0x0;
  (this->super_CLUFactorRational).u.col.len = (int *)0x0;
  (this->super_CLUFactorRational).u.col.max = (int *)0x0;
  pTVar2 = TimerFactory::createTimer(USER_TIME);
  this->solveTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  (this->super_CLUFactorRational).factorTime = pTVar2;
  spx_alloc<int*>(&(this->super_CLUFactorRational).row.perm,(this->super_CLUFactorRational).thedim);
  spx_alloc<int*>(&(this->super_CLUFactorRational).row.orig,(this->super_CLUFactorRational).thedim);
  spx_alloc<int*>(&(this->super_CLUFactorRational).col.perm,(this->super_CLUFactorRational).thedim);
  spx_alloc<int*>(&(this->super_CLUFactorRational).col.orig,(this->super_CLUFactorRational).thedim);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&(this->super_CLUFactorRational).diag,(this->super_CLUFactorRational).thedim,true);
  (this->super_CLUFactorRational).work =
       (this->vec).val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_CLUFactorRational).u.row.used = 0;
  spx_alloc<soplex::CLUFactorRational::Dring*>
            (&(this->super_CLUFactorRational).u.row.elem,(this->super_CLUFactorRational).thedim);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&(this->super_CLUFactorRational).u.row.val,1,true);
  spx_alloc<int*>(&(this->super_CLUFactorRational).u.row.idx,
                  (int)((ulong)((long)*(pointer *)
                                       ((long)&(this->super_CLUFactorRational).u.row.val.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl + 8) -
                               (long)(this->super_CLUFactorRational).u.row.val.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6));
  spx_alloc<int*>(&(this->super_CLUFactorRational).u.row.start,
                  (this->super_CLUFactorRational).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactorRational).u.row.len,
                  (this->super_CLUFactorRational).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactorRational).u.row.max,
                  (this->super_CLUFactorRational).thedim + 1);
  iVar1 = (this->super_CLUFactorRational).thedim;
  (this->super_CLUFactorRational).u.row.list.idx = iVar1;
  (this->super_CLUFactorRational).u.row.start[iVar1] = 0;
  (this->super_CLUFactorRational).u.row.max[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).u.row.len[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).u.col.size = 1;
  (this->super_CLUFactorRational).u.col.used = 0;
  spx_alloc<soplex::CLUFactorRational::Dring*>
            (&(this->super_CLUFactorRational).u.col.elem,(this->super_CLUFactorRational).thedim);
  spx_alloc<int*>(&(this->super_CLUFactorRational).u.col.idx,
                  (this->super_CLUFactorRational).u.col.size);
  spx_alloc<int*>(&(this->super_CLUFactorRational).u.col.start,
                  (this->super_CLUFactorRational).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactorRational).u.col.len,
                  (this->super_CLUFactorRational).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactorRational).u.col.max,
                  (this->super_CLUFactorRational).thedim + 1);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&(this->super_CLUFactorRational).u.col.val,0,true);
  iVar1 = (this->super_CLUFactorRational).thedim;
  (this->super_CLUFactorRational).u.col.list.idx = iVar1;
  (this->super_CLUFactorRational).u.col.start[iVar1] = 0;
  (this->super_CLUFactorRational).u.col.max[(this->super_CLUFactorRational).thedim] = 0;
  (this->super_CLUFactorRational).u.col.len[(this->super_CLUFactorRational).thedim] = 0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&(this->super_CLUFactorRational).l.val,1,true);
  spx_alloc<int*>(&(this->super_CLUFactorRational).l.idx,
                  (int)((ulong)((long)*(pointer *)
                                       ((long)&(this->super_CLUFactorRational).l.val.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                               (long)(this->super_CLUFactorRational).l.val.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6));
  (this->super_CLUFactorRational).l.startSize = 1;
  (this->super_CLUFactorRational).l.firstUpdate = 0;
  (this->super_CLUFactorRational).l.firstUnused = 0;
  spx_alloc<int*>(&(this->super_CLUFactorRational).l.start,1);
  spx_alloc<int*>(&(this->super_CLUFactorRational).l.row,(this->super_CLUFactorRational).l.startSize
                 );
  ctx = (EVP_PKEY_CTX *)0x0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&(this->super_CLUFactorRational).l.rval,0,true);
  (this->super_CLUFactorRational).l.rorig = (int *)0x0;
  (this->super_CLUFactorRational).l.rperm = (int *)0x0;
  (this->super_CLUFactorRational).l.ridx = (int *)0x0;
  (this->super_CLUFactorRational).l.rbeg = (int *)0x0;
  init(this,ctx);
  (this->super_CLUFactorRational).factorCount = 0;
  (this->super_CLUFactorRational).timeLimit = -1.0;
  this->solveCount = 0;
  return;
}

Assistant:

SLUFactorRational()
      : CLUFactorRational()
      , vec(1)
      , ssvec(1)
      , usetup(false)
      , uptype(FOREST_TOMLIN)
      , eta(1)
      , forest(1)
      , minThreshold(0.01)
      , timerType(Timer::USER_TIME)
   {
      row.perm    = nullptr;
      row.orig    = nullptr;
      col.perm    = nullptr;
      col.orig    = nullptr;
      u.row.elem  = nullptr;
      u.row.idx   = nullptr;
      u.row.start = nullptr;
      u.row.len   = nullptr;
      u.row.max   = nullptr;
      u.col.elem  = nullptr;
      u.col.idx   = nullptr;
      u.col.start = nullptr;
      u.col.len   = nullptr;
      u.col.max   = nullptr;
      l.idx       = nullptr;
      l.start     = nullptr;
      l.row       = nullptr;
      l.ridx      = nullptr;
      l.rbeg      = nullptr;
      l.rorig     = nullptr;
      l.rperm     = nullptr;

      nzCnt  = 0;
      thedim = 0;

      try
      {
         solveTime = TimerFactory::createTimer(timerType);
         factorTime = TimerFactory::createTimer(timerType);
         spx_alloc(row.perm, thedim);
         spx_alloc(row.orig, thedim);
         spx_alloc(col.perm, thedim);
         spx_alloc(col.orig, thedim);
         diag.reDim(thedim);

         work = vec.get_ptr();

         u.row.used = 0;
         spx_alloc(u.row.elem,  thedim);
         u.row.val.reDim(1);
         spx_alloc(u.row.idx,   u.row.val.dim());
         spx_alloc(u.row.start, thedim + 1);
         spx_alloc(u.row.len,   thedim + 1);
         spx_alloc(u.row.max,   thedim + 1);

         u.row.list.idx      = thedim;
         u.row.start[thedim] = 0;
         u.row.max  [thedim] = 0;
         u.row.len  [thedim] = 0;

         u.col.size = 1;
         u.col.used = 0;
         spx_alloc(u.col.elem,  thedim);
         spx_alloc(u.col.idx,   u.col.size);
         spx_alloc(u.col.start, thedim + 1);
         spx_alloc(u.col.len,   thedim + 1);
         spx_alloc(u.col.max,   thedim + 1);
         u.col.val.reDim(0);

         u.col.list.idx      = thedim;
         u.col.start[thedim] = 0;
         u.col.max[thedim]   = 0;
         u.col.len[thedim]   = 0;

         l.val.reDim(1);
         spx_alloc(l.idx, l.val.dim());

         l.startSize   = 1;
         l.firstUpdate = 0;
         l.firstUnused = 0;

         spx_alloc(l.start, l.startSize);
         spx_alloc(l.row,   l.startSize);
      }
      catch(const SPxMemoryException& x)
      {
         freeAll();
         throw x;
      }

      l.rval.reDim(0);
      l.ridx  = nullptr;
      l.rbeg  = nullptr;
      l.rorig = nullptr;
      l.rperm = nullptr;

      SLUFactorRational::init();

      factorCount = 0;
      timeLimit = -1.0;
      solveCount  = 0;

      assert(row.perm != nullptr);
      assert(row.orig != nullptr);
      assert(col.perm != nullptr);
      assert(col.orig != nullptr);

      assert(u.row.elem  != nullptr);
      assert(u.row.idx   != nullptr);
      assert(u.row.start != nullptr);
      assert(u.row.len   != nullptr);
      assert(u.row.max   != nullptr);

      assert(u.col.elem  != nullptr);
      assert(u.col.idx   != nullptr);
      assert(u.col.start != nullptr);
      assert(u.col.len   != nullptr);
      assert(u.col.max   != nullptr);

      assert(l.idx   != nullptr);
      assert(l.start != nullptr);
      assert(l.row   != nullptr);

      assert(SLUFactorRational::isConsistent());
   }